

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamodel.cpp
# Opt level: O0

size_t __thiscall FSSDataModel::addDataSource(FSSDataModel *this,DataSourceType type,QString *path)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  shared_ptr<Data::Source> local_f8;
  shared_ptr<Data::Source> local_e8;
  QByteArray local_d8;
  char *local_c0;
  shared_ptr<DataSourceCustom> local_b8;
  QByteArray local_a8;
  char *local_90;
  shared_ptr<DataSourceAmiga> local_88 [2];
  QByteArray local_68;
  char *local_50;
  shared_ptr<DataSourceDOS> local_48;
  undefined1 local_38 [8];
  PSource source;
  QString *path_local;
  DataSourceType type_local;
  FSSDataModel *this_local;
  
  source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)path;
  std::shared_ptr<Data::Source>::shared_ptr((shared_ptr<Data::Source> *)local_38);
  if (type == DataSourceTypeDos) {
    QString::toLocal8Bit
              (&local_68,
               (QString *)
               source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
    local_50 = QByteArray::data(&local_68);
    std::make_shared<DataSourceDOS,char*>((char **)&local_48);
    std::shared_ptr<Data::Source>::operator=((shared_ptr<Data::Source> *)local_38,&local_48);
    std::shared_ptr<DataSourceDOS>::~shared_ptr(&local_48);
    QByteArray::~QByteArray(&local_68);
  }
  else if (type == DataSourceTypeAmiga) {
    QString::toLocal8Bit
              (&local_a8,
               (QString *)
               source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
    local_90 = QByteArray::data(&local_a8);
    std::make_shared<DataSourceAmiga,char*>((char **)local_88);
    std::shared_ptr<Data::Source>::operator=((shared_ptr<Data::Source> *)local_38,local_88);
    std::shared_ptr<DataSourceAmiga>::~shared_ptr(local_88);
    QByteArray::~QByteArray(&local_a8);
  }
  else if (type == DataSourceTypeCustom) {
    QString::toLocal8Bit
              (&local_d8,
               (QString *)
               source.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
    local_c0 = QByteArray::data(&local_d8);
    std::make_shared<DataSourceCustom,char*>((char **)&local_b8);
    std::shared_ptr<Data::Source>::operator=((shared_ptr<Data::Source> *)local_38,&local_b8);
    std::shared_ptr<DataSourceCustom>::~shared_ptr(&local_b8);
    QByteArray::~QByteArray(&local_d8);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Data::Source,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
    uVar2 = (*peVar3->_vptr_Source[6])();
    if ((uVar2 & 1) != 0) {
      std::shared_ptr<Data::Source>::shared_ptr(&local_e8,(shared_ptr<Data::Source> *)local_38);
      saveSetting(this,&local_e8);
      std::shared_ptr<Data::Source>::~shared_ptr(&local_e8);
      std::shared_ptr<Data::Source>::shared_ptr(&local_f8,(shared_ptr<Data::Source> *)local_38);
      this_local = (FSSDataModel *)addDataSource(this,&local_f8);
      std::shared_ptr<Data::Source>::~shared_ptr(&local_f8);
      goto LAB_00126757;
    }
  }
  this_local = (FSSDataModel *)std::numeric_limits<unsigned_long>::max();
LAB_00126757:
  std::shared_ptr<Data::Source>::~shared_ptr((shared_ptr<Data::Source> *)local_38);
  return (size_t)this_local;
}

Assistant:

size_t
FSSDataModel::addDataSource(DataSourceType type, const QString &path) {
  Data::PSource source;

  switch (type) {
    case DataSourceTypeDos:
      source = std::make_shared<DataSourceDOS>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeAmiga:
      source = std::make_shared<DataSourceAmiga>(path.toLocal8Bit().data());
      break;
    case DataSourceTypeCustom:
      source = std::make_shared<DataSourceCustom>(path.toLocal8Bit().data());
      break;
  }

  if (source && source->load()) {
    saveSetting(source);
    return addDataSource(source);
  }

  return std::numeric_limits<size_t>::max();
}